

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_score(int cur,int turncount)

{
  uint in_ESI;
  uint in_EDI;
  char buf [20];
  char acStackY_28 [8];
  char *in_stack_ffffffffffffffe0;
  
  if (in_ESI == 0xffffffff) {
    os_strsc(in_stack_ffffffffffffffe0);
  }
  else {
    sprintf(acStackY_28,"%d/%d",(ulong)in_EDI,(ulong)in_ESI);
    os_strsc(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void os_score(int cur, int turncount)
{
    char buf[20];

    /* check for the special -1 turn count */
    if (turncount == -1)
    {
        /* it's turn "-1" - we're simply redrawing the score */
        os_strsc((char *)0);
    }
    else
    {
        /* format the score */
        sprintf(buf, "%d/%d", cur, turncount);

        /* display the score string */
        os_strsc(buf);
    }
}